

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O3

bool iDynTree::estimateExternalWrenches
               (Model *model,SubModelDecomposition *subModels,SensorsList *sensors,
               LinkUnknownWrenchContacts *unknownWrenches,JointPosDoubleArray *jointPos,
               LinkVelArray *linkVel,LinkAccArray *linkProperAcc,
               SensorsMeasurements *ftSensorsMeasurements,estimateExternalWrenchesBuffers *bufs,
               LinkContactWrenches *outputContactWrenches)

{
  pointer pVVar1;
  long lVar2;
  Traversal *subModelTraversal;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  double *pdVar6;
  size_t subModelIndex;
  size_t i;
  ulong uVar7;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_150;
  pointer local_138 [2];
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  Wrench knownTerms;
  ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_d0;
  
  iDynTree::LinkContactWrenches::resize((Model *)outputContactWrenches);
  lVar2 = iDynTree::SubModelDecomposition::getNrOfSubModels();
  if (lVar2 != 0) {
    subModelIndex = 0;
    do {
      subModelTraversal =
           (Traversal *)iDynTree::SubModelDecomposition::getTraversal((ulong)subModels);
      computeKnownTermsOfEstimationEquationWithInternalFT
                (&knownTerms,model,subModelTraversal,sensors,jointPos,linkVel,linkProperAcc,
                 ftSensorsMeasurements,bufs);
      pVVar1 = (bufs->b).
               super__Vector_base<iDynTree::VectorFixSize<6U>,_std::allocator<iDynTree::VectorFixSize<6U>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar1[subModelIndex].m_data[0] = (double)knownTerms._8_8_;
      pVVar1[subModelIndex].m_data[1] = (double)knownTerms._16_8_;
      pVVar1[subModelIndex].m_data[2] = (double)knownTerms._24_8_;
      (pVVar1[subModelIndex].m_data + 2)[1] = (double)knownTerms._32_8_;
      pVVar1[subModelIndex].m_data[4] = (double)knownTerms._40_8_;
      (pVVar1[subModelIndex].m_data + 4)[1] = (double)knownTerms._48_8_;
      computeMatrixOfEstimationEquationAndExtWrenchKnownTerms
                (model,subModelTraversal,unknownWrenches,jointPos,subModelIndex,bufs);
      lVar2 = iDynTree::MatrixDynSize::rows();
      if ((lVar2 != 0) && (lVar2 = iDynTree::MatrixDynSize::cols(), lVar2 != 0)) {
        uVar3 = iDynTree::MatrixDynSize::data();
        uVar4 = iDynTree::MatrixDynSize::rows();
        local_118 = iDynTree::MatrixDynSize::cols();
        local_128 = uVar3;
        local_120 = uVar4;
        Eigen::
        MatrixBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
        colPivHouseholderQr(&local_d0,
                            (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                             *)&local_128);
        local_138[0] = (bufs->b).
                       super__Vector_base<iDynTree::VectorFixSize<6U>,_std::allocator<iDynTree::VectorFixSize<6U>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + subModelIndex;
        uVar3 = iDynTree::VectorDynSize::data();
        local_150._8_8_ = iDynTree::VectorDynSize::size();
        local_150._0_8_ = uVar3;
        Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
        _solve_impl<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
                  ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_d0,
                   (Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_> *)local_138,
                   &local_150);
        free(local_d0.m_colNormsDirect.
             super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data);
        free(local_d0.m_colNormsUpdated.
             super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data);
        free(local_d0.m_temp.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
             m_storage.m_data);
        free(local_d0.m_colsTranspositions.
             super_PlainObjectBase<Eigen::Matrix<long,_1,__1,_1,_1,__1>_>.m_storage.m_data);
        free(local_d0.m_colsPermutation.m_indices.
             super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        free(local_d0.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data);
        free(local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_data);
      }
      uVar7 = 0;
      while (uVar5 = iDynTree::VectorDynSize::size(), uVar7 < uVar5) {
        pdVar6 = (double *)
                 iDynTree::VectorDynSize::operator()
                           ((bufs->x).
                            super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                            ._M_impl.super__Vector_impl_data._M_start + subModelIndex * 0x20,uVar7);
        uVar7 = uVar7 + 1;
        if (NAN(*pdVar6)) {
          iDynTree::reportError
                    ("","estimateExternalWrenches",
                     "NaN found in estimation result, estimation failed");
          iDynTree::SpatialForceVector::~SpatialForceVector(&knownTerms.super_SpatialForceVector);
          return false;
        }
      }
      storeResultsOfEstimation
                (subModelTraversal,unknownWrenches,subModelIndex,bufs,outputContactWrenches);
      iDynTree::SpatialForceVector::~SpatialForceVector(&knownTerms.super_SpatialForceVector);
      subModelIndex = subModelIndex + 1;
      uVar7 = iDynTree::SubModelDecomposition::getNrOfSubModels();
    } while (subModelIndex < uVar7);
  }
  return true;
}

Assistant:

bool estimateExternalWrenches(const Model& model,
                              const SubModelDecomposition& subModels,
                              const SensorsList& sensors,
                              const LinkUnknownWrenchContacts& unknownWrenches,
                              const JointPosDoubleArray & jointPos,
                              const LinkVelArray& linkVel,
                              const LinkAccArray& linkProperAcc,
                              const SensorsMeasurements& ftSensorsMeasurements,
                                    estimateExternalWrenchesBuffers& bufs,
                                    LinkContactWrenches& outputContactWrenches)
{
    /**< value extracted from old iDynContact */
    double tol = 1e-7;

    // Resize the output data structure
    outputContactWrenches.resize(model);

    // Solve the problem for each submodel
    for(size_t sm=0; sm < subModels.getNrOfSubModels(); sm++ )
    {
        // Number of unknowns for this submodel
        const Traversal & subModelTraversal = subModels.getTraversal(sm);

        // First compute the known term of the estimation for each link:
        // this loop is similar to the dynamic phase of the RNEA
        // \todo pimp up performance as done in RNEADynamicPhase
        Wrench knownTerms = computeKnownTermsOfEstimationEquationWithInternalFT(model,subModelTraversal,
                                sensors,jointPos,linkVel,linkProperAcc,ftSensorsMeasurements,bufs);

        // Copy knownTerms in the buffers used for estimation
        bufs.b[sm] = knownTerms.asVector();

        // Now we compute the A matrix
        computeMatrixOfEstimationEquationAndExtWrenchKnownTerms(model,subModelTraversal,unknownWrenches,jointPos,sm,bufs);

        // If A has no unkowns then pseudoInverse can not be computed
        // In that case, we do not compute the x vector because it will have zero elements 
        if (bufs.A[sm].rows() > 0 && bufs.A[sm].cols() > 0) {
	    toEigen(bufs.x[sm]) = toEigen(bufs.A[sm]).colPivHouseholderQr().solve(toEigen(bufs.b[sm]));	    
        }

        // Check if there are any nan in the estimation results
        bool someResultIsNan = false;
        for(size_t i=0; i < bufs.x[sm].size(); i++)
        {
            if( std::isnan(bufs.x[sm](i)) )
            {
                someResultIsNan = true;
                break;
            }
        }

        if (someResultIsNan)
        {
            reportError("", "estimateExternalWrenches", "NaN found in estimation result, estimation failed");
            return false;
        }

        // We copy the estimated unknowns in the outputContactWrenches
        // Note that the logic of conversion between input/output contacts should be
        // the same used before in computeMatrixOfEstimationEquation
        storeResultsOfEstimation(subModelTraversal,unknownWrenches,sm,bufs,outputContactWrenches);
    }

    return true;
}